

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O0

void rw::wdgl::unpackattrib(float *dst,uint8 *src,AttribDesc *a,float32 scale)

{
  int local_50;
  int local_4c;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int16 *i16src;
  uint16 *u16src;
  int8 *i8src;
  float32 scale_local;
  AttribDesc *a_local;
  uint8 *src_local;
  float *dst_local;
  
  switch(a->type) {
  case 0:
    memcpy(dst,src,(long)(a->size << 2));
    break;
  case 1:
    for (i_2 = 0; i_2 < a->size; i_2 = i_2 + 1) {
      if (a->normalized == 0) {
        dst[i_2] = (float)(int)(char)src[i_2] / (float)scale;
      }
      else {
        dst[i_2] = (float)(int)(char)src[i_2] / 127.0;
      }
    }
    break;
  case 2:
    for (i_3 = 0; i_3 < a->size; i_3 = i_3 + 1) {
      if (a->normalized == 0) {
        dst[i_3] = (float)src[i_3] / (float)scale;
      }
      else {
        dst[i_3] = (float)src[i_3] / 255.0;
      }
    }
    break;
  case 3:
    for (local_4c = 0; local_4c < a->size; local_4c = local_4c + 1) {
      if (a->normalized == 0) {
        dst[local_4c] = (float)(int)*(short *)(src + (long)local_4c * 2) / (float)scale;
      }
      else {
        dst[local_4c] = (float)(int)*(short *)(src + (long)local_4c * 2) / 32767.0;
      }
    }
    break;
  case 4:
    for (local_50 = 0; local_50 < a->size; local_50 = local_50 + 1) {
      if (a->normalized == 0) {
        dst[local_50] = (float)*(ushort *)(src + (long)local_50 * 2) / (float)scale;
      }
      else {
        dst[local_50] = (float)*(ushort *)(src + (long)local_50 * 2) / 65435.0;
      }
    }
  }
  return;
}

Assistant:

void
unpackattrib(float *dst, uint8 *src, AttribDesc *a, float32 scale=1.0f)
{
	int8 *i8src;
	uint16 *u16src;
	int16 *i16src;

	switch(a->type){
	case 0:	// float
		memcpy(dst, src, a->size*4);
		break;

	// TODO: maybe have loop inside if?
	case 1: // byte
		i8src = (int8*)src;
		for(int i = 0; i < a->size; i++){
			if(!a->normalized)
				dst[i] = i8src[i]/scale;
			else
				dst[i] = i8src[i]/127.0f;
		}
		break;

	case 2: // ubyte
		for(int i = 0; i < a->size; i++){
			if(!a->normalized)
				dst[i] = src[i]/scale;
			else
				dst[i] = src[i]/255.0f;
		}
		break;

	case 3: // short
		i16src = (int16*)src;
		for(int i = 0; i < a->size; i++){
			if(!a->normalized)
				dst[i] = i16src[i]/scale;
			else
				dst[i] = i16src[i]/32767.0f;
		}
		break;

	case 4: // ushort
		u16src = (uint16*)src;
		for(int i = 0; i < a->size; i++){
			if(!a->normalized)
				dst[i] = u16src[i]/scale;
			else
				dst[i] = u16src[i]/65435.0f;
		}
		break;
	}
}